

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_Mesh * __thiscall ON_MeshRef::SetMeshForExperts(ON_MeshRef *this,ON_Mesh **mesh)

{
  ON_Mesh *local_40;
  shared_ptr<ON_Mesh> local_30;
  ON_Mesh *local_20;
  ON_Mesh *managed_mesh;
  ON_Mesh **mesh_local;
  ON_MeshRef *this_local;
  
  managed_mesh = (ON_Mesh *)mesh;
  mesh_local = (ON_Mesh **)this;
  Clear(this);
  if ((ON_Mesh *)(managed_mesh->super_ON_Geometry).super_ON_Object._vptr_ON_Object ==
      &ON_Mesh::Empty) {
    local_40 = (ON_Mesh *)0x0;
  }
  else {
    local_40 = (ON_Mesh *)(managed_mesh->super_ON_Geometry).super_ON_Object._vptr_ON_Object;
  }
  local_20 = local_40;
  (managed_mesh->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)0x0;
  if (local_40 != (ON_Mesh *)0x0) {
    std::shared_ptr<ON_Mesh>::shared_ptr<ON_Mesh,void>(&local_30,local_40);
    std::shared_ptr<ON_Mesh>::operator=(&this->m_mesh_sp,&local_30);
    std::shared_ptr<ON_Mesh>::~shared_ptr(&local_30);
  }
  return local_20;
}

Assistant:

class ON_Mesh* ON_MeshRef::SetMeshForExperts(
  class ON_Mesh*& mesh
  )
{
  Clear();
  ON_Mesh* managed_mesh = ( mesh == &ON_Mesh::Empty ) ? nullptr : mesh;
  mesh = nullptr;
  if (nullptr != managed_mesh )
    m_mesh_sp = std::shared_ptr<class ON_Mesh>(managed_mesh);
  return managed_mesh;
}